

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptProxy::DeleteProperty
          (JavascriptProxy *this,PropertyId propertyId,PropertyOperationFlags flags)

{
  code *pcVar1;
  anon_class_40_5_adc47082 implicitCall;
  RecyclableObject *scriptContext;
  bool bVar2;
  BOOL BVar3;
  ScriptContext *pSVar4;
  ThreadContext *this_00;
  HostScriptContext *this_01;
  undefined4 *puVar5;
  Var pvVar6;
  PropertyRecord *this_02;
  char16 *pcVar7;
  undefined1 local_c0 [8];
  PropertyDescriptor targetPropertyDescriptor;
  BOOL trapResult;
  Var deletePropertyResult;
  Var propertyName;
  JavascriptFunction *pJStack_48;
  uint32 indexVal;
  JavascriptFunction *deleteMethod;
  RecyclableObject *targetObj;
  RecyclableObject *handlerObj;
  ScriptContext *requestContext;
  ThreadContext *threadContext;
  PropertyOperationFlags flags_local;
  PropertyId propertyId_local;
  JavascriptProxy *this_local;
  
  threadContext._0_4_ = flags;
  threadContext._4_4_ = propertyId;
  _flags_local = this;
  pSVar4 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  this_00 = ScriptContext::GetThreadContext(pSVar4);
  pSVar4 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  ThreadContext::ProbeStack(this_00,0xc00,pSVar4,(PVOID)0x0);
  pSVar4 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  requestContext = (ScriptContext *)ScriptContext::GetThreadContext(pSVar4);
  bVar2 = ThreadContext::IsDisableImplicitCall((ThreadContext *)requestContext);
  if (bVar2) {
    ThreadContext::AddImplicitCallFlags((ThreadContext *)requestContext,ImplicitCall_External);
    this_local._4_4_ = 0;
  }
  else {
    this_01 = ThreadContext::GetPreviousHostScriptContext((ThreadContext *)requestContext);
    handlerObj = (RecyclableObject *)HostScriptContext::GetScriptContext(this_01);
    targetObj = MarshalHandler(this,(ScriptContext *)handlerObj);
    if (targetObj == (RecyclableObject *)0x0) {
      bVar2 = ThreadContext::RecordImplicitException((ThreadContext *)requestContext);
      if (bVar2) {
        JavascriptError::ThrowTypeError((ScriptContext *)handlerObj,-0x7ff5ea15,L"deleteProperty");
      }
      this_local._4_4_ = 0;
    }
    else {
      deleteMethod = (JavascriptFunction *)MarshalTarget(this,(ScriptContext *)handlerObj);
      pJStack_48 = GetMethodHelper(this,0x71,(ScriptContext *)handlerObj);
      pSVar4 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
      bVar2 = ScriptContext::IsHeapEnumInProgress(pSVar4);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                    ,800,"(!GetScriptContext()->IsHeapEnumInProgress())",
                                    "!GetScriptContext()->IsHeapEnumInProgress()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      if (pJStack_48 == (JavascriptFunction *)0x0) {
        BVar3 = ScriptContext::IsNumericPropertyId
                          ((ScriptContext *)handlerObj,threadContext._4_4_,
                           (uint32 *)((long)&propertyName + 4));
        if (BVar3 == 0) {
          this_local._4_4_ =
               (*(deleteMethod->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                 super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x21])
                         (deleteMethod,(ulong)threadContext._4_4_,
                          (ulong)(PropertyOperationFlags)threadContext);
        }
        else {
          this_local._4_4_ =
               (*(deleteMethod->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                 super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x2a])
                         (deleteMethod,(ulong)propertyName._4_4_,
                          (ulong)(PropertyOperationFlags)threadContext);
        }
      }
      else {
        pvVar6 = GetName((ScriptContext *)handlerObj,threadContext._4_4_);
        implicitCall.deleteMethod = pJStack_48;
        implicitCall.threadContext = (ThreadContext *)requestContext;
        implicitCall.handlerObj = targetObj;
        implicitCall.targetObj = (RecyclableObject *)deleteMethod;
        implicitCall.propertyName = pvVar6;
        pvVar6 = ThreadContext::
                 ExecuteImplicitCall<Js::JavascriptProxy::DeleteProperty(int,Js::PropertyOperationFlags)::__0>
                           ((ThreadContext *)requestContext,(RecyclableObject *)pJStack_48,
                            ImplicitCall_Accessor,implicitCall);
        targetPropertyDescriptor._44_4_ =
             JavascriptConversion::ToBoolean(pvVar6,(ScriptContext *)handlerObj);
        scriptContext = handlerObj;
        if (targetPropertyDescriptor._44_4_ == 0) {
          if (((PropertyOperationFlags)threadContext & PropertyOperation_StrictMode) !=
              PropertyOperation_None) {
            this_02 = ThreadContext::GetPropertyName
                                ((ThreadContext *)requestContext,threadContext._4_4_);
            pcVar7 = PropertyRecord::GetBuffer(this_02);
            JavascriptError::ThrowTypeErrorVar
                      ((ScriptContext *)scriptContext,-0x7ff5e9d4,L"deleteProperty",pcVar7);
          }
          this_local._4_4_ = 0;
        }
        else {
          PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_c0);
          BVar3 = Js::JavascriptOperators::GetOwnPropertyDescriptor
                            ((RecyclableObject *)deleteMethod,threadContext._4_4_,
                             (ScriptContext *)handlerObj,(PropertyDescriptor *)local_c0);
          if (BVar3 == 0) {
            this_local._4_4_ = 1;
          }
          else {
            bVar2 = PropertyDescriptor::IsConfigurable((PropertyDescriptor *)local_c0);
            if (!bVar2) {
              JavascriptError::ThrowTypeError
                        ((ScriptContext *)handlerObj,-0x7ff5ea14,L"deleteProperty");
            }
            this_local._4_4_ = 1;
          }
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

BOOL JavascriptProxy::DeleteProperty(PropertyId propertyId, PropertyOperationFlags flags)
    {
        PROBE_STACK(GetScriptContext(), Js::Constants::MinStackDefault);

        // Reject implicit call
        ThreadContext* threadContext = GetScriptContext()->GetThreadContext();
        if (threadContext->IsDisableImplicitCall())
        {
            threadContext->AddImplicitCallFlags(Js::ImplicitCall_External);
            return FALSE;
        }

        // Caller does not pass requestContext. Retrieve from host scriptContext stack.
        ScriptContext* requestContext =
            threadContext->GetPreviousHostScriptContext()->GetScriptContext();

        //1. Assert: IsPropertyKey(P) is true.
        //2. Let handler be the value of the[[ProxyHandler]] internal slot of O.
        RecyclableObject * handlerObj = this->MarshalHandler(requestContext);

        //3. If handler is null, then throw a TypeError exception.
        //6. ReturnIfAbrupt(trap).

        if (handlerObj == nullptr)
        {
            // the proxy has been revoked; TypeError.
            if (!threadContext->RecordImplicitException())
                return FALSE;
            JavascriptError::ThrowTypeError(requestContext, JSERR_ErrorOnRevokedProxy, _u("deleteProperty"));
        }

        //4. Let target be the value of the[[ProxyTarget]] internal slot of O.
        RecyclableObject * targetObj = this->MarshalTarget(requestContext);

        //5. Let trap be the result of GetMethod(handler, "deleteProperty").
        JavascriptFunction* deleteMethod = GetMethodHelper(PropertyIds::deleteProperty, requestContext);

        //7. If trap is undefined, then
        //a.Return the result of calling the[[Delete]] internal method of target with argument P.
        Assert(!GetScriptContext()->IsHeapEnumInProgress());
        if (nullptr == deleteMethod)
        {
            uint32 indexVal;
            if (requestContext->IsNumericPropertyId(propertyId, &indexVal))
            {
                return targetObj->DeleteItem(indexVal, flags);
            }
            else
            {
                return targetObj->DeleteProperty(propertyId, flags);
            }
        }
        //8. Let trapResult be the result of calling the[[Call]] internal method of trap with handler as the this value and a new List containing target and P.
        //9. Let booleanTrapResult be ToBoolean(trapResult).
        //10. ReturnIfAbrupt(booleanTrapResult).
        //11. If booleanTrapResult is false, then return false.

        Var propertyName = GetName(requestContext, propertyId);

        Var deletePropertyResult = threadContext->ExecuteImplicitCall(deleteMethod, ImplicitCall_Accessor, [=]()->Js::Var
        {
            return CALL_FUNCTION(threadContext, deleteMethod, CallInfo(CallFlags_Value, 3), handlerObj, targetObj, propertyName);
        });

        BOOL trapResult = JavascriptConversion::ToBoolean(deletePropertyResult, requestContext);
        if (!trapResult)
        {
            if (flags & PropertyOperation_StrictMode)
            {
                JavascriptError::ThrowTypeErrorVar(
                    requestContext, 
                    JSERR_ProxyHandlerReturnedFalse, 
                    _u("deleteProperty"),
                    threadContext->GetPropertyName(propertyId)->GetBuffer()
                );
            }
            return trapResult;
        }

        //12. Let targetDesc be the result of calling the[[GetOwnProperty]] internal method of target with argument P.
        //13. ReturnIfAbrupt(targetDesc).
        //14. If targetDesc is undefined, then return true.
        //15. If targetDesc.[[Configurable]] is false, then throw a TypeError exception.
        //16. Return true.
        PropertyDescriptor targetPropertyDescriptor;
        if (!Js::JavascriptOperators::GetOwnPropertyDescriptor(targetObj, propertyId, requestContext, &targetPropertyDescriptor))
        {
            return TRUE;
        }
        if (!targetPropertyDescriptor.IsConfigurable())
        {
            JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("deleteProperty"));
        }
        return TRUE;
    }